

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  string *this;
  FILE *__stream;
  int iVar1;
  LogDestination *this_00;
  long lVar2;
  long *plVar3;
  MutexLock local_40;
  MutexLock local_38;
  MutexLock l;
  
  local_38.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar1 != 0) {
LAB_00128b05:
      abort();
    }
  }
  plVar3 = &log_destinations_;
  lVar2 = 0;
  do {
    this_00 = (LogDestination *)*plVar3;
    if (this_00 == (LogDestination *)0x0) {
      this_00 = (LogDestination *)operator_new(0xe8);
      LogDestination(this_00,(LogSeverity)lVar2,(char *)0x0);
      *plVar3 = (long)this_00;
    }
    local_40.mu_ = &(this_00->fileobject_).lock_;
    if ((this_00->fileobject_).lock_.is_safe_ == true) {
      iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_40.mu_);
      if (iVar1 != 0) goto LAB_00128b05;
    }
    this = &(this_00->fileobject_).filename_extension_;
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this,ext);
    if (iVar1 != 0) {
      __stream = (FILE *)(this_00->fileobject_).file_;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
        (this_00->fileobject_).file_ = (FILE *)0x0;
        (this_00->fileobject_).rollover_attempt_ = 0x1f;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (this,ext);
    }
    ::glog_internal_namespace_::MutexLock::~MutexLock(&local_40);
    lVar2 = lVar2 + 1;
    plVar3 = plVar3 + 1;
    if (lVar2 == 4) {
      ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
      return;
    }
  } while( true );
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for ( int severity = 0; severity < NUM_SEVERITIES; ++severity ) {
    log_destination(severity)->fileobject_.SetExtension(ext);
  }
}